

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::
     WriteDeltaFor(unsigned_short *values,bool *validity,bitpacking_width_t width,
                  unsigned_short frame_of_reference,short delta_offset,
                  unsigned_short *original_values,idx_t count,void *data_ptr)

{
  unsigned_short *puVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  
  uVar3 = CONCAT71(in_register_00000011,width) & 0xffffffff;
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,iVar2 + 6);
  WriteMetaData((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,DELTA_FOR);
  puVar1 = *(unsigned_short **)((long)data_ptr + 0x40);
  *puVar1 = frame_of_reference;
  puVar1[1] = (unsigned_short)uVar3;
  puVar1[2] = delta_offset;
  *(unsigned_short **)((long)data_ptr + 0x40) = puVar1 + 3;
  BitpackingPrimitives::PackBuffer<unsigned_short,false>
            ((data_ptr_t)(puVar1 + 3),values,count,(bitpacking_width_t)uVar3);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}